

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityCosseratMesh::SetAsCircularSection
          (ChElasticityCosseratMesh *this,double diameter)

{
  vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  ChVector2<double> local_58;
  double local_40;
  double local_38;
  
  pCVar1 = (this->vertexes).
           super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertexes).
      super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar1) {
    (this->vertexes).
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pCVar1;
  }
  pCVar2 = (this->triangles).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->vertexes;
  if ((this->triangles).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar2) {
    (this->triangles).
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  dVar3 = diameter * 0.5;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
  emplace_back<chrono::ChVector2<double>>
            ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)this_00,
             &local_58);
  local_58.m_data[1] = 0.0;
  local_58.m_data[0] = dVar3;
  std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
  emplace_back<chrono::ChVector2<double>>
            ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)this_00,
             &local_58);
  iVar4 = 0xc;
  uVar5 = 0;
  while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
    uVar6 = uVar5 + 1;
    local_40 = (double)(int)uVar6 * 0.5235987755982988;
    local_38 = cos(local_40);
    local_38 = local_38 * dVar3;
    local_58.m_data[1] = sin(local_40);
    local_58.m_data[1] = local_58.m_data[1] * dVar3;
    local_58.m_data[0] = local_38;
    std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
    emplace_back<chrono::ChVector2<double>>
              ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)
               this_00,&local_58);
    local_58.m_data[0] = (double)((ulong)uVar6 << 0x20);
    local_58.m_data[1] = (double)CONCAT44(local_58.m_data[1]._4_4_,uVar5 + 2);
    std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
    emplace_back<chrono::ChVector<int>>
              ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &this->triangles,(ChVector<int> *)&local_58);
    uVar5 = uVar6;
  }
  return;
}

Assistant:

void ChElasticityCosseratMesh::SetAsCircularSection(double diameter) {
    this->vertexes.clear();
    this->triangles.clear();

    double rad = diameter * 0.5;
    this->vertexes.push_back(ChVector2<>(0, 0));
    this->vertexes.push_back(ChVector2<>(rad, 0));
    int ntri = 12;
    for (int i = 0; i < ntri; ++i) {
        double alpha = (i + 1) * (CH_C_2PI / (double)ntri);
        this->vertexes.push_back(ChVector2<>(rad * cos(alpha), rad * sin(alpha)));
        this->triangles.push_back(ChVector<int>(0, i + 1, i + 2));
    }

    // set Ks using Timoshenko-Gere formula for solid circular shape
    /*
    double poisson = this->E / (2.0 * this->G) - 1.0;
    this->Ks_y = 6.0 * (1.0 + poisson) / (7.0 + 6.0 * poisson);
    this->Ks_z = this->Ks_y;
    */
}